

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::image::anon_unknown_0::SizeTest::createInstance(SizeTest *this,Context *context)

{
  ImageType IVar1;
  Context *context_local;
  SizeTest *this_local;
  
  IVar1 = Texture::type(&this->m_texture);
  if (IVar1 == IMAGE_TYPE_BUFFER) {
    this_local = (SizeTest *)operator_new(0xd8);
    BufferSizeTestInstance::BufferSizeTestInstance
              ((BufferSizeTestInstance *)this_local,context,&this->m_texture,this->m_format);
  }
  else {
    this_local = (SizeTest *)operator_new(0xd8);
    ImageSizeTestInstance::ImageSizeTestInstance
              ((ImageSizeTestInstance *)this_local,context,&this->m_texture,this->m_format);
  }
  return (TestInstance *)this_local;
}

Assistant:

TestInstance* SizeTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferSizeTestInstance(context, m_texture, m_format);
	else
		return new ImageSizeTestInstance(context, m_texture, m_format);
}